

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUTF8CollationIterator::previousSegment
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  ushort local_86;
  uint8_t trailCC;
  uint16_t fcd16;
  uint local_74;
  UChar32 c;
  int32_t cpLimit;
  uint8_t nextCC;
  UnicodeString s;
  int32_t segmentLimit;
  UErrorCode *errorCode_local;
  FCDUTF8CollationIterator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return '\0';
  }
  s.fUnion._52_4_ = (this->super_UTF8CollationIterator).pos;
  UnicodeString::UnicodeString((UnicodeString *)&cpLimit);
  c._3_1_ = 0;
  while( true ) {
    iVar5 = (this->super_UTF8CollationIterator).pos;
    iVar4 = (this->super_UTF8CollationIterator).pos + -1;
    (this->super_UTF8CollationIterator).pos = iVar4;
    bVar2 = (this->super_UTF8CollationIterator).u8[iVar4];
    local_74 = (uint)bVar2;
    if ((bVar2 & 0x80) != 0) {
      local_74 = utf8_prevCharSafeBody_63
                           ((this->super_UTF8CollationIterator).u8,0,
                            &(this->super_UTF8CollationIterator).pos,local_74,-3);
    }
    local_86 = Normalizer2Impl::getFCD16(this->nfcImpl,local_74);
    bVar2 = (byte)local_86;
    if ((bVar2 == 0) && (iVar5 != s.fUnion._52_4_)) break;
    UnicodeString::append((UnicodeString *)&cpLimit,local_74);
    if ((bVar2 != 0) &&
       (((c._3_1_ != 0 && (c._3_1_ < bVar2)) ||
        (UVar1 = CollationFCD::isFCD16OfTibetanCompositeVowel(local_86), UVar1 != '\0'))))
    goto LAB_0028fb8a;
    c._3_1_ = (byte)(local_86 >> 8);
    if (((this->super_UTF8CollationIterator).pos == 0) || (c._3_1_ == 0)) goto LAB_0028fd5a;
  }
  (this->super_UTF8CollationIterator).pos = iVar5;
LAB_0028fd5a:
  this->start = (this->super_UTF8CollationIterator).pos;
  (this->super_UTF8CollationIterator).pos = s.fUnion._52_4_;
  this->state = IN_FCD_SEGMENT;
  this_local._7_1_ = '\x01';
  goto LAB_0028fd8e;
LAB_0028fb8a:
  bVar6 = false;
  if (0xff < local_86) {
    bVar6 = (this->super_UTF8CollationIterator).pos != 0;
  }
  if (!bVar6) goto LAB_0028fc8f;
  iVar3 = (this->super_UTF8CollationIterator).pos;
  iVar5 = (this->super_UTF8CollationIterator).pos + -1;
  (this->super_UTF8CollationIterator).pos = iVar5;
  bVar2 = (this->super_UTF8CollationIterator).u8[iVar5];
  local_74 = (uint)bVar2;
  if ((bVar2 & 0x80) != 0) {
    local_74 = utf8_prevCharSafeBody_63
                         ((this->super_UTF8CollationIterator).u8,0,
                          &(this->super_UTF8CollationIterator).pos,local_74,-3);
  }
  local_86 = Normalizer2Impl::getFCD16(this->nfcImpl,local_74);
  if (local_86 == 0) goto code_r0x0028fc6a;
  UnicodeString::append((UnicodeString *)&cpLimit,local_74);
  goto LAB_0028fb8a;
code_r0x0028fc6a:
  (this->super_UTF8CollationIterator).pos = iVar3;
LAB_0028fc8f:
  UnicodeString::reverse((UnicodeString *)&cpLimit);
  UVar1 = normalize(this,(UnicodeString *)&cpLimit,errorCode);
  if (UVar1 == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    this->limit = s.fUnion._52_4_;
    this->start = (this->super_UTF8CollationIterator).pos;
    this->state = IN_NORMALIZED;
    iVar3 = UnicodeString::length(&this->normalized);
    (this->super_UTF8CollationIterator).pos = iVar3;
    this_local._7_1_ = '\x01';
  }
LAB_0028fd8e:
  UnicodeString::~UnicodeString((UnicodeString *)&cpLimit);
  return this_local._7_1_;
}

Assistant:

UBool
FCDUTF8CollationIterator::previousSegment(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(state == CHECK_BWD && pos != 0);
    // The input text [pos..limit[ passes the FCD check.
    int32_t segmentLimit = pos;
    // Collect the characters being checked, in case they need to be normalized.
    UnicodeString s;
    uint8_t nextCC = 0;
    for(;;) {
        // Fetch the previous character and its fcd16 value.
        int32_t cpLimit = pos;
        UChar32 c;
        U8_PREV_OR_FFFD(u8, 0, pos, c);
        uint16_t fcd16 = nfcImpl.getFCD16(c);
        uint8_t trailCC = (uint8_t)fcd16;
        if(trailCC == 0 && cpLimit != segmentLimit) {
            // FCD boundary after this character.
            pos = cpLimit;
            break;
        }
        s.append(c);
        if(trailCC != 0 && ((nextCC != 0 && trailCC > nextCC) ||
                            CollationFCD::isFCD16OfTibetanCompositeVowel(fcd16))) {
            // Fails FCD check. Find the previous FCD boundary and normalize.
            while(fcd16 > 0xff && pos != 0) {
                cpLimit = pos;
                U8_PREV_OR_FFFD(u8, 0, pos, c);
                fcd16 = nfcImpl.getFCD16(c);
                if(fcd16 == 0) {
                    pos = cpLimit;
                    break;
                }
                s.append(c);
            }
            s.reverse();
            if(!normalize(s, errorCode)) { return FALSE; }
            limit = segmentLimit;
            start = pos;
            state = IN_NORMALIZED;
            pos = normalized.length();
            return TRUE;
        }
        nextCC = (uint8_t)(fcd16 >> 8);
        if(pos == 0 || nextCC == 0) {
            // FCD boundary before the following character.
            break;
        }
    }
    start = pos;
    pos = segmentLimit;
    U_ASSERT(pos != start);
    state = IN_FCD_SEGMENT;
    return TRUE;
}